

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  stbi__uint32 sVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *puVar8;
  void *pvVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  undefined1 auVar18 [12];
  int local_6c;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar1 = stbi__get_marker(z);
  if (sVar1 == 0xd8) {
    if (scan == 1) {
      return 1;
    }
    bVar2 = stbi__get_marker(z);
    while ((bVar2 != 0xc2 && ((bVar2 & 0xfe) != 0xc0))) {
      iVar3 = stbi__process_marker(z,(uint)bVar2);
      if (iVar3 == 0) {
        return 0;
      }
      while (bVar2 = stbi__get_marker(z), bVar2 == 0xff) {
        iVar3 = stbi__at_eof(z->s);
        if (iVar3 != 0) {
          puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
          pcVar10 = "no SOF";
          goto LAB_0013ebcf;
        }
      }
    }
    z->progressive = (uint)(bVar2 == 0xc2);
    s = z->s;
    uVar4 = stbi__get16be(s);
    if (10 < uVar4) {
      sVar1 = stbi__get8(s);
      if (sVar1 != '\b') {
        puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
        pcVar10 = "only 8-bit";
        goto LAB_0013ebcf;
      }
      sVar5 = stbi__get16be(s);
      s->img_y = sVar5;
      if (sVar5 == 0) {
        puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
        pcVar10 = "no header height";
        goto LAB_0013ebcf;
      }
      sVar5 = stbi__get16be(s);
      s->img_x = sVar5;
      if (sVar5 == 0) {
        puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
        pcVar10 = "0 width";
        goto LAB_0013ebcf;
      }
      if (0x1000000 < s->img_y) {
        puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
        pcVar10 = "too large";
        goto LAB_0013ebcf;
      }
      bVar2 = stbi__get8(s);
      if ((4 < bVar2) || ((0x1aU >> (bVar2 & 0x1f) & 1) == 0)) {
        puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
        pcVar10 = "bad component count";
        goto LAB_0013ebcf;
      }
      s->img_n = (uint)bVar2;
      for (lVar11 = 0; (ulong)bVar2 * 0x60 - lVar11 != 0; lVar11 = lVar11 + 0x60) {
        *(undefined8 *)((long)&z->img_comp[0].data + lVar11) = 0;
        *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar11) = 0;
      }
      if (uVar4 == (uint)bVar2 + (uint)bVar2 * 2 + 8) {
        z->rgb = 0;
        piVar15 = &z->img_comp[0].tq;
        lVar11 = 0;
        while (uVar4 = s->img_n, lVar11 < (int)uVar4) {
          bVar2 = stbi__get8(s);
          ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar2;
          if ((s->img_n == 3) &&
             (bVar2 == *(byte *)((long)&stbi__process_frame_header(stbi__jpeg*,int)::rgb + lVar11)))
          {
            z->rgb = z->rgb + 1;
          }
          bVar2 = stbi__get8(s);
          piVar15[-2] = (uint)(bVar2 >> 4);
          if ((byte)(bVar2 + 0xb0) < 0xc0) goto LAB_0013ee98;
          piVar15[-1] = bVar2 & 0xf;
          if ((bVar2 & 0xf) - 5 < 0xfffffffc) goto LAB_0013ee80;
          bVar2 = stbi__get8(s);
          *piVar15 = (uint)bVar2;
          lVar11 = lVar11 + 1;
          piVar15 = piVar15 + 0x18;
          if (3 < bVar2) goto code_r0x0013edbb;
        }
        if (scan != 0) {
          return 1;
        }
        sVar5 = s->img_x;
        b_00 = s->img_y;
        uVar16 = 0;
        iVar3 = stbi__mad3sizes_valid(sVar5,b_00,uVar4,0);
        if (iVar3 == 0) {
          puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
          *puVar8 = "too large";
          return 0;
        }
        uVar12 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar12 = uVar16;
        }
        lVar11 = uVar12 * 0x60;
        uVar4 = 1;
        uVar12 = 1;
        for (; iVar3 = (int)uVar12, lVar11 - uVar16 != 0; uVar16 = uVar16 + 0x60) {
          uVar6 = *(uint *)((long)&z->img_comp[0].h + uVar16);
          uVar7 = *(uint *)((long)&z->img_comp[0].v + uVar16);
          if ((int)uVar4 < (int)uVar6) {
            uVar4 = uVar6;
          }
          if (iVar3 < (int)uVar7) {
            uVar12 = (ulong)uVar7;
          }
        }
        lVar13 = -0x60;
        do {
          if (lVar11 - (lVar13 + 0x60) == 0) {
            z->img_h_max = uVar4;
            z->img_v_max = iVar3;
            z->img_mcu_w = uVar4 * 8;
            z->img_mcu_h = iVar3 * 8;
            lVar13 = 0;
            uVar6 = ((sVar5 + uVar4 * 8) - 1) / (uVar4 * 8);
            z->img_mcu_x = uVar6;
            uVar7 = ((b_00 + iVar3 * 8) - 1) / (uint)(iVar3 * 8);
            z->img_mcu_y = uVar7;
            local_6c = 1;
            while( true ) {
              if (lVar11 == lVar13) {
                return 1;
              }
              iVar14 = *(int *)((long)&z->img_comp[0].h + lVar13);
              iVar17 = *(int *)((long)&z->img_comp[0].v + lVar13);
              *(uint *)((long)&z->img_comp[0].x + lVar13) = (iVar14 * sVar5 + (uVar4 - 1)) / uVar4;
              *(int *)((long)&z->img_comp[0].y + lVar13) =
                   (int)((iVar17 * b_00 + iVar3 + -1) / uVar12);
              iVar14 = iVar14 * uVar6;
              a = iVar14 * 8;
              *(int *)((long)&z->img_comp[0].w2 + lVar13) = a;
              iVar17 = iVar17 * uVar7;
              b = iVar17 * 8;
              *(int *)((long)&z->img_comp[0].h2 + lVar13) = b;
              pvVar9 = stbi__malloc_mad2(a,b,0xf);
              *(undefined8 *)((long)&z->img_comp[0].coeff + lVar13) = 0;
              puVar8 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar13);
              *puVar8 = 0;
              puVar8[1] = 0;
              *(void **)((long)&z->img_comp[0].raw_data + lVar13) = pvVar9;
              if (pvVar9 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].data + lVar13) =
                   (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
              if (z->progressive != 0) {
                *(int *)((long)&z->img_comp[0].coeff_w + lVar13) = iVar14;
                *(int *)((long)&z->img_comp[0].coeff_h + lVar13) = iVar17;
                pvVar9 = stbi__malloc_mad3(a,b,2,0xf);
                *(void **)((long)&z->img_comp[0].raw_coeff + lVar13) = pvVar9;
                if (pvVar9 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].coeff + lVar13) =
                     (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
              }
              local_6c = local_6c + 1;
              lVar13 = lVar13 + 0x60;
            }
            auVar18 = __tls_get_addr(&PTR_0016bd50);
            *auVar18._0_8_ = "outofmem";
            stbi__free_jpeg_components(z,local_6c,auVar18._8_4_);
            return 0;
          }
          if ((int)uVar4 % *(int *)((long)&z->img_comp[1].h + lVar13) != 0) goto LAB_0013ee98;
          piVar15 = (int *)((long)&z->img_comp[1].v + lVar13);
          lVar13 = lVar13 + 0x60;
          if (iVar3 % *piVar15 != 0) {
LAB_0013ee80:
            puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
            pcVar10 = "bad V";
            goto LAB_0013ebcf;
          }
        } while( true );
      }
    }
    puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
    pcVar10 = "bad SOF len";
  }
  else {
    puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
    pcVar10 = "no SOI";
  }
  goto LAB_0013ebcf;
code_r0x0013edbb:
  puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
  pcVar10 = "bad TQ";
  goto LAB_0013ebcf;
LAB_0013ee98:
  puVar8 = (undefined8 *)__tls_get_addr(&PTR_0016bd50);
  pcVar10 = "bad H";
LAB_0013ebcf:
  *puVar8 = pcVar10;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}